

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O0

KeySym anon_unknown.dwarf_21ec7a::scancodeToKeySym(Scancode code)

{
  KeyCode KVar1;
  Display *display_00;
  KeyCode keycode;
  KeySym keysym;
  Display *display;
  undefined8 local_18;
  
  display_00 = sf::priv::OpenDisplay();
  local_18 = 0;
  KVar1 = scancodeToKeyCode(0x248084);
  if (KVar1 != '\0') {
    local_18 = XkbKeycodeToKeysym(display_00,KVar1,0);
  }
  sf::priv::CloseDisplay(display_00);
  return local_18;
}

Assistant:

KeySym scancodeToKeySym(sf::Keyboard::Scancode code)
{
    Display* display = sf::priv::OpenDisplay();

    KeySym keysym = NoSymbol;
    KeyCode keycode = scancodeToKeyCode(code);

    if (keycode != NullKeyCode) // ensure that this Scancode is mapped to keycode
        keysym = XkbKeycodeToKeysym(display, keycode, 0, 0);

    sf::priv::CloseDisplay(display);

    return keysym;
}